

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schemeobject.h
# Opt level: O0

void __thiscall SchemeSymbol::SchemeSymbol(SchemeSymbol *this,string *s)

{
  string *s_local;
  SchemeSymbol *this_local;
  
  SchemeObject::SchemeObject(&this->super_SchemeObject);
  (this->super_SchemeObject)._vptr_SchemeObject = (_func_int **)&PTR__SchemeSymbol_00245a90;
  std::__cxx11::string::string((string *)&this->value,(string *)s);
  this->uninterned = false;
  return;
}

Assistant:

SchemeSymbol(std::string s) : value(s)
    {}